

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O1

C_Node * add(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  bool bVar1;
  C_Token *tok_00;
  _Bool _Var2;
  C_Node *pCVar3;
  C_Node *unaff_RBX;
  C_Node *lhs;
  C_Token *local_38;
  
  local_38 = tok;
  pCVar3 = mul(parser,&local_38,tok);
  do {
    lhs = pCVar3;
    tok_00 = local_38;
    _Var2 = C_equal(local_38,"+");
    if (_Var2) {
      pCVar3 = mul(parser,&local_38,tok_00->next);
      pCVar3 = new_add(parser,lhs,pCVar3,tok_00);
LAB_001274b0:
      bVar1 = true;
      lhs = unaff_RBX;
    }
    else {
      _Var2 = C_equal(tok_00,"-");
      if (_Var2) {
        pCVar3 = mul(parser,&local_38,tok_00->next);
        pCVar3 = new_sub(parser,lhs,pCVar3,tok_00);
        goto LAB_001274b0;
      }
      *rest = tok_00;
      bVar1 = false;
      pCVar3 = lhs;
    }
    unaff_RBX = lhs;
    if (!bVar1) {
      return lhs;
    }
  } while( true );
}

Assistant:

static C_Node *add(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Node *node = mul(parser, &tok, tok);

  for (;;) {
    C_Token *start = tok;

    if (C_equal(tok, "+")) {
      node = new_add(parser, node, mul(parser, &tok, tok->next), start);
      continue;
    }

    if (C_equal(tok, "-")) {
      node = new_sub(parser, node, mul(parser, &tok, tok->next), start);
      continue;
    }

    *rest = tok;
    return node;
  }
}